

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int * generateProperInputVector(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randomVector)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int n;
  int numins;
  int numouts;
  int input;
  int bit;
  int k;
  int j;
  int i;
  int *vPiValues;
  Vec_Int_t *randomVector_local;
  coloring *c_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPoNum(pNtk);
  iVar2 = Abc_NtkPiNum(pNtk);
  pNtk_local = (Abc_Ntk_t *)malloc((long)iVar2 << 2);
  k = iVar1;
  for (input = 0; (k < iVar1 + iVar2 && (iVar3 = Vec_IntSize(randomVector), input != iVar3));
      input = input + 1) {
    iVar3 = Vec_IntEntry(randomVector,input);
    for (bit = k; bit <= k + c->clen[k]; bit = bit + 1) {
      pNtk_local->nObjCounts[(long)(c->lab[bit] - iVar1) + -0x18] = iVar3;
    }
    k = c->clen[k] + 1 + k;
  }
  if (k < iVar1 + iVar2) {
    if (pNtk_local != (Abc_Ntk_t *)0x0) {
      free(pNtk_local);
    }
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return (int *)pNtk_local;
}

Assistant:

static int * 
generateProperInputVector( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randomVector )
{
    int * vPiValues;    
    int i, j, k, bit, input;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numouts + numins;

    vPiValues = ABC_ALLOC( int,  numins);   

    for (i = numouts, k = 0; i < n; i += (c->clen[i]+1), k++) {
        if (k == Vec_IntSize(randomVector)) break;

        bit = Vec_IntEntry(randomVector, k);
        for (j = i; j <= (i + c->clen[i]); j++) {
            input = c->lab[j] - numouts;
            vPiValues[input] = bit;
        }
    }

    //if (k != Vec_IntSize(randomVector)) {
    if (i < n) {
        ABC_FREE( vPiValues );
        return NULL;
    }

    return vPiValues;
}